

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshVertexListBlock(Parser *this,uint iNumVertices,Mesh *mesh)

{
  byte bVar1;
  char *pcVar2;
  pointer paVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  uint iIndex;
  aiVector3D vTemp;
  int local_4c;
  uint local_48;
  undefined8 local_44;
  float local_3c;
  Mesh *local_38;
  
  local_38 = mesh;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)mesh,
             (ulong)iNumVertices);
  local_4c = 0;
LAB_00413a99:
  do {
    pcVar2 = this->filePtr;
    if (*pcVar2 == '*') {
      this->filePtr = pcVar2 + 1;
      iVar5 = strncmp("MESH_VERTEX",pcVar2 + 1,0xb);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xc];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar2 + 0xd;
          if (bVar1 == 0) {
            pcVar7 = pcVar2 + 0xc;
          }
          this->filePtr = pcVar7;
          local_44 = 0;
          local_3c = 0.0;
          ParseLV4MeshFloatTriple(this,(ai_real *)&local_44,&local_48);
          if (local_48 < iNumVertices) {
            paVar3 = (local_38->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            *(float *)((long)(paVar3 + local_48) + 8) = local_3c;
            paVar3 = paVar3 + local_48;
            paVar3->x = (float)(undefined4)local_44;
            paVar3->y = (float)local_44._4_4_;
          }
          else {
            LogWarning(this,"Invalid vertex index. It will be ignored");
          }
          goto LAB_00413a99;
        }
      }
    }
    pbVar4 = (byte *)this->filePtr;
    bVar1 = *pbVar4;
    uVar6 = (uint)bVar1;
    if (bVar1 == 0x7b) {
      local_4c = local_4c + 1;
    }
    else if (bVar1 == 0x7d) {
      local_4c = local_4c + -1;
      if (local_4c == 0) {
        this->filePtr = (char *)(pbVar4 + 1);
        SkipToNextToken(this);
        return;
      }
    }
    else if (uVar6 == 0) {
      LogError(this,"Encountered unexpected EOL while parsing a *MESH_VERTEX_LIST chunk (Level 3)");
    }
    if (((uVar6 < 0xe) && ((0x3401U >> (uVar6 & 0x1f) & 1) != 0)) &&
       (this->bLastWasEndLine == false)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    this->filePtr = (char *)(pbVar4 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshVertexListBlock(
    unsigned int iNumVertices, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    // allocate enough storage in the array
    mesh.mPositions.resize(iNumVertices);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Vertex entry
            if (TokenMatch(filePtr,"MESH_VERTEX" ,11))
            {

                aiVector3D vTemp;
                unsigned int iIndex;
                ParseLV4MeshFloatTriple(&vTemp.x,iIndex);

                if (iIndex >= iNumVertices)
                {
                    LogWarning("Invalid vertex index. It will be ignored");
                }
                else mesh.mPositions[iIndex] = vTemp;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_VERTEX_LIST");
    }
    return;
}